

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

int compile(Vm *vm)

{
  int val;
  Vm *vm_local;
  
  (vm->compiler).print_expr = true;
  vm->current_status = VM_STATUS_COMPILING;
  if ((vm->compiler).scope[0].size == 0) {
    declare_natives(vm);
  }
  vm_local._4_4_ = _setjmp((__jmp_buf_tag *)error_buf);
  if (vm_local._4_4_ == 0) {
    do {
      stmt(vm);
    } while ((vm->compiler).token.type != TOKEN_EOF);
    emit_no_arg(vm,OP_RETURN);
    vm_local._4_4_ = 0;
  }
  return vm_local._4_4_;
}

Assistant:

int compile(Vm *vm) {
    vm->compiler.print_expr = true;
    vm->current_status = VM_STATUS_COMPILING;

    if (vm->compiler.scope[0].size <= 0) {
        declare_natives(vm);
    }

    int val = setjmp(error_buf);
    if (val) {
        return val;
    }

    do {
        stmt(vm);
    } while (vm->compiler.token.type != TOKEN_EOF);

    emit_no_arg(vm, OP_RETURN);

    return 0;

}